

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O2

Token * __thiscall enact::Lexer::string(Token *__return_storage_ptr__,Lexer *this)

{
  char cVar1;
  bool bVar2;
  string *value_00;
  string value;
  allocator<char> local_89;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  size_type local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  string local_68;
  string local_48;
  
  local_80 = 0;
  local_78._M_local_buf[0] = '\0';
  bVar2 = false;
  local_88 = &local_78;
  do {
    if ((this->m_source)._M_string_length <= this->m_current) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,"Unterminated string.",&local_89);
      errorToken(__return_storage_ptr__,this,&local_68);
LAB_00111b22:
      value_00 = &local_68;
LAB_00111b27:
      std::__cxx11::string::~string((string *)value_00);
LAB_00111b2c:
      std::__cxx11::string::~string((string *)&local_88);
      return __return_storage_ptr__;
    }
    cVar1 = (this->m_source)._M_dataplus._M_p[this->m_current];
    if (bVar2) {
      if ((((cVar1 != '\"') && (cVar1 != '\\')) && (cVar1 != 'n')) &&
         ((cVar1 != 'r' && (cVar1 != 't')))) {
        if (cVar1 != '(') {
          advance(this);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_68,"Unrecognised escape sequence.",&local_89);
          errorToken(__return_storage_ptr__,this,&local_68);
          goto LAB_00111b22;
        }
        advance(this);
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        if (local_88 == &local_78) {
          local_48.field_2._8_8_ = local_78._8_8_;
        }
        else {
          local_48._M_dataplus._M_p = (pointer)local_88;
        }
        local_48.field_2._M_allocated_capacity._1_7_ = local_78._M_allocated_capacity._1_7_;
        local_48.field_2._M_local_buf[0] = local_78._M_local_buf[0];
        value_00 = &local_48;
        local_48._M_string_length = local_80;
        local_80 = 0;
        local_78._M_local_buf[0] = '\0';
        local_88 = &local_78;
        interpolationStart(__return_storage_ptr__,this,value_00);
        goto LAB_00111b27;
      }
LAB_00111ae5:
      std::__cxx11::string::push_back((char)&local_88);
      bVar2 = false;
    }
    else {
      bVar2 = true;
      if (cVar1 != '\\') {
        if (cVar1 != '\"') goto LAB_00111ae5;
        advance(this);
        __return_storage_ptr__->type = STRING;
        std::__cxx11::string::string((string *)&__return_storage_ptr__->lexeme,(string *)&local_88);
        __return_storage_ptr__->line = this->m_line;
        __return_storage_ptr__->col = this->m_col;
        goto LAB_00111b2c;
      }
    }
    advance(this);
  } while( true );
}

Assistant:

Token Lexer::string() {
        std::string value;
        bool inEscapeSequence = false;
        while (!isAtEnd()) {
            const char c = peek();

            if (inEscapeSequence) {
                switch (c) {
                    case 'n':
                        value.push_back('\n');
                        break;
                    case 'r':
                        value.push_back('\r');
                        break;
                    case 't':
                        value.push_back('\t');
                        break;
                    case '\\':
                        value.push_back('\\');
                        break;
                    case '"':
                        value.push_back('"');
                        break;
                    case '(':
                        // Eat the '('
                        advance();
                        return interpolationStart(std::move(value));
                    default:
                        advance();
                        return errorToken("Unrecognised escape sequence.");
                }

                inEscapeSequence = false;
            } else {
                if (c == '"') break;
                if (c == '\\') {
                    inEscapeSequence = true;
                    advance();
                    continue;
                }

                value.push_back(c);
            }

            advance();
        }

        if (isAtEnd()) {
            return errorToken("Unterminated string.");
        }

        // Eat the close quote.
        advance();

        return Token{TokenType::STRING, value, m_line, m_col};
    }